

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O2

UBool uset_getSerializedRange_63
                (USerializedSet *set,int32_t rangeIndex,UChar32 *pStart,UChar32 *pEnd)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint16_t *puVar4;
  uint uVar5;
  int iVar6;
  UChar32 UVar7;
  uint uVar8;
  
  if ((pEnd == (UChar32 *)0x0 || rangeIndex < 0) ||
      (pStart == (UChar32 *)0x0 || set == (USerializedSet *)0x0)) {
    return '\0';
  }
  puVar4 = set->array;
  iVar6 = set->length;
  iVar3 = set->bmpLength;
  uVar5 = rangeIndex * 2;
  if ((int)uVar5 < iVar3) {
    uVar8 = uVar5 | 1;
    *pStart = (uint)puVar4[uVar5];
    if ((int)uVar8 < iVar3) {
      UVar7 = puVar4[uVar8] - 1;
      goto LAB_002d97bf;
    }
    UVar7 = 0x10ffff;
    if (iVar6 <= (int)uVar8) goto LAB_002d97bf;
    uVar1 = puVar4[uVar8];
    uVar2 = puVar4[(ulong)uVar5 + 2];
  }
  else {
    uVar5 = (uVar5 - iVar3) * 2;
    iVar6 = iVar6 - iVar3;
    if (iVar6 <= (int)uVar5) {
      return '\0';
    }
    *pStart = CONCAT22(puVar4[(long)iVar3 + (long)(int)uVar5],
                       puVar4[(long)iVar3 + (long)(int)(uVar5 | 1)]);
    UVar7 = 0x10ffff;
    if (iVar6 <= (int)(uVar5 + 2)) goto LAB_002d97bf;
    uVar1 = puVar4[(long)iVar3 + (long)(int)(uVar5 + 2)];
    uVar2 = puVar4[(long)iVar3 + (long)(int)uVar5 + 3];
  }
  UVar7 = (uint)uVar2 + (uint)uVar1 * 0x10000 + -1;
LAB_002d97bf:
  *pEnd = UVar7;
  return '\x01';
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_getSerializedRange(const USerializedSet* set, int32_t rangeIndex,
                        UChar32* pStart, UChar32* pEnd) {
    const uint16_t* array;
    int32_t bmpLength, length;

    if(set==NULL || rangeIndex<0 || pStart==NULL || pEnd==NULL) {
        return FALSE;
    }

    array=set->array;
    length=set->length;
    bmpLength=set->bmpLength;

    rangeIndex*=2; /* address start/limit pairs */
    if(rangeIndex<bmpLength) {
        *pStart=array[rangeIndex++];
        if(rangeIndex<bmpLength) {
            *pEnd=array[rangeIndex]-1;
        } else if(rangeIndex<length) {
            *pEnd=((((int32_t)array[rangeIndex])<<16)|array[rangeIndex+1])-1;
        } else {
            *pEnd=0x10ffff;
        }
        return TRUE;
    } else {
        rangeIndex-=bmpLength;
        rangeIndex*=2; /* address pairs of pairs of units */
        length-=bmpLength;
        if(rangeIndex<length) {
            array+=bmpLength;
            *pStart=(((int32_t)array[rangeIndex])<<16)|array[rangeIndex+1];
            rangeIndex+=2;
            if(rangeIndex<length) {
                *pEnd=((((int32_t)array[rangeIndex])<<16)|array[rangeIndex+1])-1;
            } else {
                *pEnd=0x10ffff;
            }
            return TRUE;
        } else {
            return FALSE;
        }
    }
}